

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

logical pnga_allocate(Integer g_a)

{
  int iVar1;
  long lVar2;
  long lVar3;
  C_Integer *pCVar4;
  ulong uVar5;
  logical lVar6;
  Integer *pIVar7;
  long lVar8;
  int grp_id;
  long lVar9;
  C_Integer CVar10;
  short sVar11;
  Integer _ndim_1;
  Integer ndims;
  long lVar12;
  global_array_t *pgVar13;
  long lVar14;
  long lVar15;
  long *adj;
  long lVar16;
  long lVar17;
  Integer IVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  ulong local_1e0;
  global_array_t *local_1d8;
  Integer local_1d0;
  long local_1c8;
  Integer _ndim;
  long local_1b8;
  Integer local_1b0;
  Integer hi [7];
  Integer dims [7];
  Integer blk [7];
  Integer chunk [7];
  Integer pe [7];
  Integer width [7];
  
  IVar18 = GAnproc;
  lVar9 = g_a + 1000;
  local_1d0 = GAme;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar19 = lVar9 * 0x368;
  if (GA[lVar9].ndim == -1) {
    pnga_error("Insufficient data to create global array",0);
  }
  iVar1 = GA_Default_Proc_Group;
  grp_id = GA[lVar9].p_handle;
  if (GA[lVar9].p_handle == GA_Init_Proc_Group) {
    GA[lVar9].p_handle = GA_Default_Proc_Group;
    grp_id = iVar1;
  }
  lVar20 = (long)grp_id;
  pnga_pgroup_sync(lVar20);
  if (0 < grp_id) {
    IVar18 = (Integer)PGRP_LIST[lVar20].map_nproc;
    local_1d0 = (Integer)PGRP_LIST[lVar20].map_proc_list[GAme];
  }
  if (GAinitialized == '\0') {
    pnga_error("GA not initialized ",0);
  }
  local_1c8 = lVar20;
  if (ma_address_init == '\0') {
    gai_ma_address_init();
  }
  pgVar13 = GA;
  sVar11 = GA[lVar9].ndim;
  ndims = (Integer)sVar11;
  if (0 < ndims) {
    memcpy(width,GA[g_a + 1000].width,ndims * 8);
  }
  if (pgVar13[lVar9].distr_type == 0 && pgVar13[lVar9].mapc == (C_Integer *)0x0) {
    if (0 < sVar11) {
      lVar20 = 0;
      do {
        dims[lVar20] = pgVar13[g_a + 1000].dims[lVar20];
        chunk[lVar20] = pgVar13[g_a + 1000].chunk[lVar20];
        lVar20 = lVar20 + 1;
      } while (ndims != lVar20);
      if (CONCAT44(chunk[0]._4_4_,(undefined4)chunk[0]) == 0) {
        if (0 < sVar11) {
          memset(blk,0xff,ndims * 8);
LAB_00162b48:
          lVar20 = 0;
          do {
            if (dims[lVar20] == 1) {
              blk[lVar20] = 1;
            }
            lVar20 = lVar20 + 1;
          } while (ndims != lVar20);
        }
      }
      else if (0 < sVar11) {
        lVar20 = 0;
        do {
          lVar8 = dims[lVar20];
          if (chunk[lVar20] < dims[lVar20]) {
            lVar8 = chunk[lVar20];
          }
          blk[lVar20] = lVar8;
          lVar20 = lVar20 + 1;
        } while (ndims != lVar20);
        if (0 < sVar11) goto LAB_00162b48;
      }
    }
    pnga_pgroup_sync(local_1c8);
    if (grp_id == 0) {
      IVar18 = (long)PGRP_LIST->map_nproc;
    }
    else if (GA[lVar9].num_rstrctd != 0) {
      IVar18 = GA[lVar9].num_rstrctd;
    }
    ddb_h2(ndims,dims,IVar18,0.0,0,blk,pe);
    if (sVar11 < 1) {
      lVar20 = 0;
      pgVar13 = GA;
    }
    else {
      lVar20 = 0;
      pIVar7 = mapALL;
      do {
        lVar8 = chunk[lVar20];
        lVar15 = dims[lVar20];
        if (lVar8 < 2) {
          lVar14 = pe[lVar20];
          lVar15 = lVar15 - (blk[lVar20] + -1) * lVar14;
        }
        else {
          lVar2 = lVar15;
          if (lVar8 < lVar15) {
            lVar2 = lVar8;
          }
          lVar14 = pe[lVar20];
          lVar15 = (1 - blk[lVar20]) * lVar14 + (lVar15 + -1) / lVar2 + 1;
        }
        if ((lVar14 < 1) || (dims[lVar20] < 1)) {
          lVar2 = 0;
        }
        else {
          lVar3 = 0;
          lVar16 = 0;
          do {
            lVar17 = blk[lVar20] - (ulong)(lVar15 <= lVar3);
            pIVar7[lVar3] = lVar16 + 1;
            if (1 < lVar8) {
              lVar14 = dims[lVar20];
              if (lVar8 < dims[lVar20]) {
                lVar14 = lVar8;
              }
              lVar17 = lVar17 * lVar14;
            }
            lVar2 = lVar3 + 1;
            lVar14 = pe[lVar20];
            if (lVar14 <= lVar2) break;
            lVar16 = lVar16 + lVar17;
            lVar3 = lVar3 + 1;
          } while (lVar16 < dims[lVar20]);
        }
        pgVar13 = GA;
        if (lVar14 < lVar2) {
          lVar2 = lVar14;
        }
        pe[lVar20] = lVar2;
        pIVar7 = pIVar7 + lVar2;
        lVar20 = lVar20 + 1;
      } while (lVar20 != ndims);
      if (sVar11 < 1) {
        lVar20 = 0;
      }
      else {
        lVar8 = 0;
        lVar20 = 0;
        do {
          lVar15 = pe[lVar8];
          pgVar13[g_a + 1000].nblock[lVar8] = (int)lVar15;
          lVar20 = lVar20 + lVar15;
          lVar8 = lVar8 + 1;
        } while (ndims != lVar8);
      }
    }
    pCVar4 = (C_Integer *)malloc(lVar20 * 8 + 8);
    pgVar13[lVar9].mapc = pCVar4;
    pIVar7 = mapALL;
    if (lVar20 < 1) {
      pCVar4 = GA[lVar9].mapc;
    }
    else {
      pCVar4 = GA[lVar9].mapc;
      lVar9 = 0;
      do {
        pCVar4[lVar9] = pIVar7[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar20 != lVar9);
    }
    pCVar4[lVar20] = -1;
    lVar20 = 0;
  }
  else {
    switch(pgVar13[lVar9].distr_type) {
    case 1:
      lVar8 = pgVar13[lVar9].block_total;
      _ndim = ndims;
      local_1b8 = lVar19;
      local_1b0 = g_a;
      if (lVar8 <= GAme) goto switchD_001629f7_default;
      lVar9 = pgVar13[lVar9].num_blocks[0];
      lVar20 = 0;
      IVar18 = GAme;
      do {
        lVar15 = (long)(int)IVar18 % lVar9;
        chunk[0]._0_4_ = (int)lVar15;
        if (1 < sVar11) {
          lVar3 = 0;
          lVar2 = IVar18;
          lVar14 = lVar9;
          do {
            lVar2 = (long)((int)lVar2 - (int)lVar15) / lVar14;
            lVar14 = pgVar13[g_a + 1000].num_blocks[lVar3 + 1];
            lVar15 = (long)(int)lVar2 % lVar14;
            *(int *)((long)chunk + lVar3 * 4 + 4) = (int)lVar15;
            lVar3 = lVar3 + 1;
          } while ((ulong)(uint)(int)sVar11 - 1 != lVar3);
        }
        if (sVar11 < 1) {
LAB_00162b04:
          lVar15 = 1;
        }
        else {
          lVar15 = 0;
          do {
            iVar1 = *(int *)((long)chunk + lVar15);
            lVar14 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar15 * 2);
            *(long *)((long)dims + lVar15 * 2) = lVar14 * iVar1 + 1;
            lVar14 = ((long)iVar1 + 1) * lVar14;
            lVar2 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar15 * 2);
            if (lVar2 <= lVar14) {
              lVar14 = lVar2;
            }
            *(long *)((long)hi + lVar15 * 2) = lVar14;
            lVar15 = lVar15 + 4;
          } while ((ulong)(uint)(int)sVar11 << 2 != lVar15);
          if (sVar11 < 1) goto LAB_00162b04;
          lVar15 = 1;
          lVar14 = 0;
          do {
            lVar15 = lVar15 * ((hi[lVar14] - dims[lVar14]) + 1);
            lVar14 = lVar14 + 1;
          } while (ndims != lVar14);
        }
        lVar20 = lVar20 + lVar15;
        IVar18 = IVar18 + GAnproc;
      } while (IVar18 < lVar8);
      break;
    case 2:
      lVar8 = (long)pgVar13[lVar9].nblock[0];
      lVar20 = GAme % lVar8;
      hi[0] = lVar20;
      if (1 < sVar11) {
        lVar15 = 0;
        IVar18 = GAme;
        do {
          IVar18 = (IVar18 - lVar20) / (long)(int)lVar8;
          lVar8 = (long)pgVar13[g_a + 1000].nblock[lVar15 + 1];
          lVar20 = IVar18 % lVar8;
          hi[lVar15 + 1] = lVar20;
          lVar15 = lVar15 + 1;
        } while (ndims + -1 != lVar15);
      }
      lVar20 = 1;
      if (0 < sVar11) {
        lVar8 = 0;
        do {
          lVar20 = lVar20 * pgVar13[lVar9].nblock[lVar8];
          lVar8 = lVar8 + 1;
        } while (ndims != lVar8);
      }
      lVar8 = pgVar13[lVar9].num_rstrctd;
      if ((pgVar13[lVar9].num_rstrctd == 0) && (lVar8 = GAnproc, -1 < (long)pgVar13[lVar9].p_handle)
         ) {
        lVar8 = (long)PGRP_LIST[pgVar13[lVar9].p_handle].map_nproc;
      }
      _ndim = ndims;
      local_1b8 = lVar19;
      local_1b0 = g_a;
      if (lVar20 != lVar8) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (sVar11 < 1) {
LAB_001635d4:
        lVar20 = 1;
      }
      else {
        local_1d8 = GA + lVar9;
        lVar20 = 1;
        lVar9 = 0;
        do {
          lVar8 = hi[lVar9];
          if (lVar8 < local_1d8->num_blocks[lVar9]) {
            lVar17 = (long)local_1d8->nblock[lVar9];
            lVar19 = local_1d8->dims[lVar9];
            lVar14 = local_1d8->block_dims[lVar9];
            lVar3 = lVar14 * (lVar8 + 1);
            lVar15 = ((lVar8 + 1) - lVar17) * lVar14;
            lVar21 = lVar14 * lVar17;
            lVar16 = (lVar17 - lVar8) * lVar14;
            lVar2 = 0;
            do {
              lVar12 = lVar2;
              lVar22 = lVar14 * lVar8;
              lVar2 = lVar19;
              if (lVar3 < lVar19) {
                lVar2 = lVar3;
              }
              lVar8 = lVar8 + lVar17;
              lVar15 = lVar15 + lVar21;
              lVar16 = lVar16 - lVar21;
              lVar3 = lVar3 + lVar21;
              lVar2 = (lVar12 - lVar22) + lVar2;
            } while (lVar8 < local_1d8->num_blocks[lVar9]);
            if (lVar19 < lVar15) {
              lVar15 = lVar19;
            }
            lVar15 = lVar16 + lVar12 + lVar15;
            ndims = _ndim;
            lVar19 = local_1b8;
            g_a = local_1b0;
          }
          else {
            lVar15 = 0;
          }
          lVar20 = lVar20 * lVar15;
          lVar9 = lVar9 + 1;
        } while (lVar9 != ndims);
      }
      break;
    case 3:
      lVar8 = (long)pgVar13[lVar9].nblock[0];
      lVar20 = GAme % lVar8;
      hi[0] = lVar20;
      if (1 < sVar11) {
        lVar15 = 0;
        IVar18 = GAme;
        do {
          IVar18 = (IVar18 - lVar20) / (long)(int)lVar8;
          lVar8 = (long)pgVar13[g_a + 1000].nblock[lVar15 + 1];
          lVar20 = IVar18 % lVar8;
          hi[lVar15 + 1] = lVar20;
          lVar15 = lVar15 + 1;
        } while (ndims + -1 != lVar15);
      }
      lVar20 = 1;
      if (0 < sVar11) {
        lVar8 = 0;
        do {
          lVar20 = lVar20 * pgVar13[lVar9].nblock[lVar8];
          lVar8 = lVar8 + 1;
        } while (ndims != lVar8);
      }
      lVar8 = pgVar13[lVar9].num_rstrctd;
      if ((pgVar13[lVar9].num_rstrctd == 0) && (lVar8 = GAnproc, -1 < (long)pgVar13[lVar9].p_handle)
         ) {
        lVar8 = (long)PGRP_LIST[pgVar13[lVar9].p_handle].map_nproc;
      }
      _ndim = ndims;
      local_1b8 = lVar19;
      local_1b0 = g_a;
      if (lVar20 != lVar8) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (sVar11 < 1) goto LAB_001635d4;
      local_1d8 = GA + lVar9;
      lVar20 = 1;
      lVar9 = 0;
      do {
        lVar8 = hi[lVar9];
        if (lVar8 < local_1d8->num_blocks[lVar9]) {
          lVar17 = (long)local_1d8->nblock[lVar9];
          lVar19 = local_1d8->dims[lVar9];
          lVar14 = local_1d8->block_dims[lVar9];
          lVar3 = lVar14 * (lVar8 + 1);
          lVar15 = ((lVar8 + 1) - lVar17) * lVar14;
          lVar21 = lVar14 * lVar17;
          lVar16 = (lVar17 - lVar8) * lVar14;
          lVar2 = 0;
          do {
            lVar12 = lVar2;
            lVar22 = lVar14 * lVar8;
            lVar2 = lVar19;
            if (lVar3 < lVar19) {
              lVar2 = lVar3;
            }
            lVar8 = lVar8 + lVar17;
            lVar15 = lVar15 + lVar21;
            lVar16 = lVar16 - lVar21;
            lVar3 = lVar3 + lVar21;
            lVar2 = (lVar12 - lVar22) + lVar2;
          } while (lVar8 < local_1d8->num_blocks[lVar9]);
          if (lVar19 < lVar15) {
            lVar15 = lVar19;
          }
          lVar15 = lVar16 + lVar12 + lVar15;
          ndims = _ndim;
          lVar19 = local_1b8;
          g_a = local_1b0;
        }
        else {
          lVar15 = 0;
        }
        lVar20 = lVar20 * lVar15;
        lVar9 = lVar9 + 1;
      } while (lVar9 != ndims);
      break;
    case 4:
      lVar8 = (long)pgVar13[lVar9].nblock[0];
      lVar20 = GAme % lVar8;
      hi[0] = lVar20;
      if (1 < sVar11) {
        lVar15 = 0;
        IVar18 = GAme;
        do {
          IVar18 = (IVar18 - lVar20) / (long)(int)lVar8;
          lVar8 = (long)pgVar13[g_a + 1000].nblock[lVar15 + 1];
          lVar20 = IVar18 % lVar8;
          hi[lVar15 + 1] = lVar20;
          lVar15 = lVar15 + 1;
        } while (ndims + -1 != lVar15);
      }
      lVar20 = 1;
      if (0 < sVar11) {
        lVar8 = 0;
        do {
          lVar20 = lVar20 * pgVar13[lVar9].nblock[lVar8];
          lVar8 = lVar8 + 1;
        } while (ndims != lVar8);
      }
      lVar8 = pgVar13[lVar9].num_rstrctd;
      if ((pgVar13[lVar9].num_rstrctd == 0) && (lVar8 = GAnproc, -1 < (long)pgVar13[lVar9].p_handle)
         ) {
        lVar8 = (long)PGRP_LIST[pgVar13[lVar9].p_handle].map_nproc;
      }
      _ndim = ndims;
      local_1b8 = lVar19;
      local_1b0 = g_a;
      if (lVar20 != lVar8) {
        pnga_error("Number of processors in processor grid must equal available processors",0);
      }
      if (sVar11 < 1) goto LAB_001635d4;
      lVar20 = 1;
      lVar8 = 0;
      lVar15 = 0;
      do {
        lVar14 = hi[lVar15];
        lVar2 = GA[lVar9].num_blocks[lVar15];
        if (lVar14 < lVar2) {
          lVar3 = 0;
          do {
            if (lVar14 < lVar2 + -1) {
              CVar10 = GA[lVar9].mapc[lVar8 + lVar14 + 1] + -1;
            }
            else {
              CVar10 = GA[lVar9].dims[lVar15];
            }
            lVar3 = (lVar3 - GA[lVar9].mapc[lVar8 + lVar14]) + CVar10 + 1;
            lVar14 = lVar14 + GA[lVar9].nblock[lVar15];
          } while (lVar14 < lVar2);
        }
        else {
          lVar3 = 0;
        }
        lVar20 = lVar20 * lVar3;
        lVar8 = lVar8 + lVar2;
        lVar15 = lVar15 + 1;
      } while (lVar15 != ndims);
      break;
    default:
switchD_001629f7_default:
      lVar20 = 0;
    }
  }
  GAstat.numcre = GAstat.numcre + 1;
  *(undefined4 *)((long)GA->dims + lVar19 + -0x28) = 1;
  IVar18 = pnga_cluster_nnodes();
  pgVar13 = GA;
  if ((IVar18 == 1) && (*(int *)((long)GA->block_dims + lVar19 + -0x18) == 0)) {
    *(undefined4 *)((long)GA->block_dims + lVar19 + -0x18) = 0xffffffff;
  }
  sVar11 = (short)ndims;
  if (*(int *)((long)pgVar13->block_dims + lVar19 + -4) == 0) {
    if (sVar11 < 1) {
      lVar6 = 0;
    }
    else {
      lVar9 = 0;
      do {
        pgVar13[g_a + 1000].scale[lVar9] =
             (double)pgVar13[g_a + 1000].nblock[lVar9] / (double)pgVar13[g_a + 1000].dims[lVar9];
        lVar9 = lVar9 + 1;
        lVar6 = ndims;
      } while (ndims != lVar9);
    }
    pnga_set_ghost_corner_flag(g_a,lVar6);
    IVar18 = local_1d0;
    if (grp_id == 0) {
      IVar18 = (Integer)PGRP_LIST->map_proc_list[GAme];
    }
    pnga_distribution(g_a,IVar18,(Integer *)((long)GA->lo + lVar19),hi);
    if (*(long *)((long)GA->old_nblock + lVar19 + -0x30) == 0) {
      if (0 < sVar11) goto LAB_00162ed6;
      uVar5 = 1;
    }
    else {
      bVar23 = *(long *)((long)GA->old_nblock + lVar19 + -0x28) == 1;
      uVar5 = (ulong)bVar23;
      if ((bVar23) && (0 < sVar11)) {
LAB_00162ed6:
        uVar5 = 1;
        lVar9 = 0;
        do {
          uVar5 = uVar5 * ((hi[lVar9] - GA[g_a + 1000].lo[lVar9]) + width[lVar9] * 2 + 1);
          lVar9 = lVar9 + 1;
        } while (ndims != lVar9);
      }
    }
    lVar20 = (long)*(int *)((long)GA->dims + lVar19 + -0x18) * uVar5;
    pgVar13 = GA;
  }
  else {
    lVar20 = lVar20 * *(int *)((long)pgVar13->dims + lVar19 + -0x18);
    if (0 < sVar11) {
      lVar9 = 0;
      do {
        *(double *)((long)pgVar13->scale + lVar9 * 8 + lVar19) =
             (double)*(long *)((long)pgVar13->num_blocks + lVar9 * 8 + lVar19) /
             (double)*(long *)((long)pgVar13->dims + lVar9 * 8 + lVar19);
        lVar9 = lVar9 + 1;
      } while (ndims != lVar9);
    }
  }
  *(undefined8 *)((long)pgVar13->dims + lVar19 + -8) = 0xffffffffffffffff;
  *(long *)((long)pgVar13->dims + lVar19 + -0x20) = lVar20;
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory - lVar20;
    local_1e0 = (ulong)~GA_total_memory >> 0x3f;
    IVar18 = pnga_type_f2c(0x3f2);
    if (grp_id < 1) {
      pnga_gop(IVar18,&local_1e0,1,"&&");
    }
    else {
      pnga_pgroup_gop(local_1c8,IVar18,&local_1e0,1,"&&");
    }
    pgVar13 = GA;
    if (local_1e0 == 0) {
      *(undefined8 *)(*(long *)(GA->name + lVar19 + -0x10) + local_1d0 * 8) = 0;
      goto LAB_001631d6;
    }
  }
  else {
    local_1e0 = 1;
  }
  adj = (long *)((long)pgVar13->dims + lVar19 + -8);
  iVar1 = *(int *)((long)pgVar13->dims + lVar19 + -0x2c);
  if (*(int *)(pgVar13->mem_dev + lVar19 + -4) == 0) {
    iVar1 = gai_get_shmem(*(char ***)(pgVar13->name + lVar19 + -0x10),lVar20,iVar1,adj,grp_id);
  }
  else {
    iVar1 = gai_get_devmem(pgVar13->mem_dev + lVar19,*(char ***)(pgVar13->name + lVar19 + -0x10),
                           lVar20,iVar1,adj,grp_id,*(int *)(pgVar13->mem_dev + lVar19 + -4),
                           pgVar13->mem_dev + lVar19);
  }
  local_1e0 = (ulong)(iVar1 == 0);
LAB_001631d6:
  if (((*(int *)((long)GA->block_dims + lVar19 + -4) == 0) &&
      (*(int *)((long)GA->dims + lVar19 + -0x14) == 1)) &&
     (lVar6 = pnga_set_ghost_info(g_a), lVar6 == 0)) {
    pnga_error("Could not allocate update information for ghost cells",0);
  }
  pnga_pgroup_sync(local_1c8);
  if (local_1e0 == 0) {
    if (GA_memory_limited == '\x01') {
      GA_total_memory = GA_total_memory + lVar20;
    }
    pnga_destroy(g_a);
    lVar6 = 0;
  }
  else {
    GAstat.curmem = GAstat.curmem + *(long *)((long)GA->dims + lVar19 + -0x20);
    lVar9 = GAstat.curmem;
    if (GAstat.curmem < GAstat.maxmem) {
      lVar9 = GAstat.maxmem;
    }
    lVar6 = 1;
    GAstat.maxmem = lVar9;
  }
  return lVar6;
}

Assistant:

logical pnga_allocate(Integer g_a)
{

  Integer hi[MAXDIM];
  Integer ga_handle = g_a + GA_OFFSET;
  Integer d, width[MAXDIM], ndim;
  Integer mem_size, nelem, pnum;
  Integer i, status, maplen=0, p_handle;
  Integer dims[MAXDIM], chunk[MAXDIM];
  Integer pe[MAXDIM], *pmap[MAXDIM], *map;
  Integer blk[MAXDIM];
  Integer grp_me=GAme, grp_nproc=GAnproc;
  Integer block_size = 0;

  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  if (GA[ga_handle].ndim == -1)
    pnga_error("Insufficient data to create global array",0);

  p_handle = (Integer)GA[ga_handle].p_handle;
  if (p_handle == (Integer)GA_Init_Proc_Group) {
    GA[ga_handle].p_handle = GA_Default_Proc_Group;
    p_handle = GA_Default_Proc_Group;
  }
  pnga_pgroup_sync(p_handle);

  if (p_handle > 0) {
     grp_nproc  = PGRP_LIST[p_handle].map_nproc;
     grp_me = PGRP_LIST[p_handle].map_proc_list[GAme];
  }
  
  if(!GAinitialized) pnga_error("GA not initialized ", 0);
  if(!ma_address_init) gai_ma_address_init();

  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) width[i] = (C_Integer)GA[ga_handle].width[i];

  /* The data distribution has not been specified by the user. Create
     default distribution */
  if (GA[ga_handle].mapc == NULL && GA[ga_handle].distr_type == REGULAR) {
    for (d=0; d<ndim; d++) {
      dims[d] = (Integer)GA[ga_handle].dims[d];
      chunk[d] = (Integer)GA[ga_handle].chunk[d];
    }
    if(chunk[0]!=0) /* for chunk[0]=0 compute all */
      for(d=0; d< ndim; d++) blk[d]=(Integer)GA_MIN(chunk[d],dims[d]);
    else
      for(d=0; d< ndim; d++) blk[d]=-1;

    /* eliminate dimensions =1 from ddb analysis */
    for(d=0; d<ndim; d++)if(dims[d]==1)blk[d]=1;
 
    if (GAme==0 && DEBUG )
      for (d=0;d<ndim;d++) fprintf(stderr,"b[%ld]=%ld\n",(long)d,(long)blk[d]);
    pnga_pgroup_sync(p_handle);

    /* ddb(ndim, dims, GAnproc, blk, pe);*/
    if(p_handle == 0) /* for mirrored arrays */
#if OLD_DISTRIBUTION
       ddb_h2(ndim, dims, PGRP_LIST[p_handle].map_nproc,0.0,(Integer)0, blk, pe);
#else
       ddb(ndim, dims, PGRP_LIST[p_handle].map_nproc, blk, pe);
#endif
    else
       if (GA[ga_handle].num_rstrctd == 0) {
         /* Data is normally distributed on processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, grp_nproc,0.0,(Integer)0, blk, pe);
#else
         ddb(ndim, dims, grp_nproc, blk, pe);
#endif
       } else {
         /* Data is only distributed on subset of processors */
#if OLD_DISTRIBUTION
         ddb_h2(ndim, dims, GA[ga_handle].num_rstrctd, 0.0, (Integer)0, blk, pe);
#else
         ddb(ndim, dims, GA[ga_handle].num_rstrctd, blk, pe);
#endif
       }

    for(d=0, map=mapALL; d< ndim; d++){
      Integer nblock;
      Integer pcut; /* # procs that get full blk[] elements; the rest gets less*/
      int p;

      pmap[d] = map;

      /* RJH ... don't leave some nodes without data if possible
       but respect the users block size */
      
      if (chunk[d] > 1) {
        Integer ddim = ((dims[d]-1)/GA_MIN(chunk[d],dims[d]) + 1);
        pcut = (ddim -(blk[d]-1)*pe[d]) ;
      }
      else {
        pcut = (dims[d]-(blk[d]-1)*pe[d]) ;
      }

      for (nblock=i=p=0; (p<pe[d]) && (i<dims[d]); p++, nblock++) {
        Integer b = blk[d];
        if (p >= pcut)
          b = b-1;
        map[nblock] = i+1;
        if (chunk[d]>1) b *= GA_MIN(chunk[d],dims[d]);
        i += b;
      }

      pe[d] = GA_MIN(pe[d],nblock);
      map +=  pe[d]; 
    }
    if(GAme==0&& DEBUG){
      gai_print_subscript("pe ",(int)ndim, pe,"\n");
      gai_print_subscript("blocks ",(int)ndim, blk,"\n");
      printf("decomposition map\n");
      for(d=0; d< ndim; d++){
        printf("dim=%ld: ",(long)d); 
        for (i=0;i<pe[d];i++)printf("%ld ",(long)pmap[d][i]);
        printf("\n"); 
      }
      fflush(stdout);
    }
    maplen = 0;
    for( i = 0; i< ndim; i++){
      GA[ga_handle].nblock[i] = pe[i];
      maplen += pe[i];
    }
    GA[ga_handle].mapc = (C_Integer*)malloc((maplen+1)*sizeof(C_Integer*));
    for(i = 0; i< maplen; i++) {
      GA[ga_handle].mapc[i] = (C_Integer)mapALL[i];
    }
    GA[ga_handle].mapc[maplen] = -1;
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    /* Regular block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer nblocks = GA[ga_handle].block_total;
    Integer tsize, j;
    Integer lo[MAXDIM];
    block_size = 0;
    for (i=GAme; i<nblocks; i +=GAnproc) {
      ga_ownsM(ga_handle,i,lo,hi);
      tsize = 1;
      for (j=0; j<ndim; j++) {
        tsize *= (hi[j] - lo[j] + 1);
      }
      block_size += tsize;
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK) {
    /* ScaLAPACK block-cyclic data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = j*GA[ga_handle].block_dims[i] + 1;
        imax = (j+1)*GA[ga_handle].block_dims[i];
        if (imax > GA[ga_handle].dims[i]) imax = GA[ga_handle].dims[i];
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    /* Tiled data distribution has been specified. Figure
       out how much memory is needed by each processor to store blocks */
    Integer j, jtot, skip, imin, imax, tot;
    Integer index[MAXDIM];
    Integer offset = 0;
    gam_find_tile_proc_indices(ga_handle,GAme,index);
    block_size = 1;
    tot = 1;
    for (i=0; i<GA[ga_handle].ndim; i++) {
      tot *= GA[ga_handle].nblock[i];
    }
    if (GA[ga_handle].num_rstrctd == 0) {
      pnum = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    } else {
      pnum = GA[ga_handle].num_rstrctd;
    }
    if (tot != pnum)
      pnga_error("Number of processors in processor grid must equal available processors",0);
    for (i=0; i<ndim; i++) {
      skip = GA[ga_handle].nblock[i];
      jtot = 0;
      for (j=index[i]; j<GA[ga_handle].num_blocks[i]; j += skip) {
        imin = GA[ga_handle].mapc[offset+j];
        if (j<GA[ga_handle].num_blocks[i]-1) {
          imax = GA[ga_handle].mapc[offset+j+1]-1;
        } else {
          imax = GA[ga_handle].dims[i];
        }
        jtot += (imax-imin+1);
      }
      block_size *= jtot;
      offset += GA[ga_handle].num_blocks[i];
    }
  }

  GAstat.numcre ++;

  GA[ga_handle].actv = 1;
  /* If only one node is being used and array is mirrored,
   * set proc list to world group */
  if (pnga_cluster_nnodes() == 1 && GA[ga_handle].p_handle == 0) {
    GA[ga_handle].p_handle = pnga_pgroup_get_world();
  }

  /* Set remaining parameters and determine memory size if regular data
   * distribution is being used */
  if (GA[ga_handle].distr_type == REGULAR) {
    /* set corner flag, if it has not already been set and set up message
       passing data */
    if (GA[ga_handle].corner_flag == -1) {
       i = 1;
    } else {
       i = GA[ga_handle].corner_flag;
    }
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].nblock[i]
         / (double)GA[ga_handle].dims[i];
    }
    pnga_set_ghost_corner_flag(g_a, i);
 
    /*** determine which portion of the array I am supposed to hold ***/
    if (p_handle == 0) { /* for mirrored arrays */
       Integer me_local = (Integer)PGRP_LIST[p_handle].map_proc_list[GAme];
       pnga_distribution(g_a, me_local, GA[ga_handle].lo, hi);
    } else {
       pnga_distribution(g_a, grp_me, GA[ga_handle].lo, hi);
    }
    if (GA[ga_handle].num_rstrctd == 0 || GA[ga_handle].has_data == 1) {
      for( i = 0, nelem=1; i< ndim; i++){
        /*
        GA[ga_handle].chunk[i] = ((C_Integer)hi[i]-GA[ga_handle].lo[i]+1);
        */
        nelem *= (hi[i]-(Integer)GA[ga_handle].lo[i]+1+2*width[i]);
      }
    } else {
      nelem = 0;
    }
    mem_size = nelem * GA[ga_handle].elemsize;
  } else {
    mem_size = block_size * GA[ga_handle].elemsize;
    for( i = 0; i< ndim; i++){
       GA[ga_handle].scale[i] = (double)GA[ga_handle].num_blocks[i]
         / (double)GA[ga_handle].dims[i];
    }
  }
  GA[ga_handle].id = INVALID_MA_HANDLE;
  GA[ga_handle].size = (C_Long)mem_size;
  /* if requested, enforce limits on memory consumption */
  if(GA_memory_limited) GA_total_memory -= mem_size;
  /* check if everybody has enough memory left */
  if(GA_memory_limited){
     status = (GA_total_memory >= 0) ? 1 : 0;
     if (p_handle > 0) {
        /* pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_pgroup_gop(p_handle,pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     } else {
        /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
        pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
     }
  }else status = 1;

  if (status) {
    if (GA[ga_handle].mem_dev_set) {
      status = !gai_get_devmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle,
          GA[ga_handle].mem_dev_set, GA[ga_handle].mem_dev);
    } else {
      status = !gai_getmem(GA[ga_handle].name, GA[ga_handle].ptr,mem_size,
          GA[ga_handle].type, &GA[ga_handle].id, p_handle);
    }
  } else {
     GA[ga_handle].ptr[grp_me]=NULL;
  }

  if (GA[ga_handle].distr_type == REGULAR) {
    /* Finish setting up information for ghost cell updates */
    if (GA[ga_handle].ghosts == 1) {
      if (!pnga_set_ghost_info(g_a))
        pnga_error("Could not allocate update information for ghost cells",0);
    }
    /* If array is mirrored, evaluate first and last indices */
    /* ngai_get_first_last_indices(&g_a); */
  }

  pnga_pgroup_sync(p_handle);
  if (status) {
    GAstat.curmem += (long)GA[ga_handle].size;
    GAstat.maxmem  = (long)GA_MAX(GAstat.maxmem, GAstat.curmem);
    status = TRUE;
  } else {
    if(GA_memory_limited) GA_total_memory += mem_size;
    pnga_destroy(g_a);
    status = FALSE;
  }
  return status;
}